

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action __thiscall
Search::search::predictLDF
          (search *this,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
          size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,size_t learner_id,
          float weight)

{
  action_repr item;
  action a_00;
  size_t sVar1;
  action_repr *paVar2;
  uint in_ECX;
  ulong uVar3;
  long in_RSI;
  long *in_RDI;
  action *in_R8;
  size_t in_R9;
  undefined8 in_stack_00000008;
  features *in_stack_00000010;
  v_array<Search::action_repr> *in_stack_00000018;
  action a;
  float a_cost;
  float in_stack_000003ac;
  size_t in_stack_000003b0;
  action *in_stack_000003b8;
  ptag in_stack_000003c4;
  size_t in_stack_000003c8;
  example *in_stack_000003d0;
  search_private *in_stack_000003d8;
  ptag *in_stack_00000400;
  char *in_stack_00000408;
  action *in_stack_00000410;
  size_t in_stack_00000418;
  float *in_stack_00000420;
  size_t in_stack_00000428;
  float *in_stack_00000430;
  value_type *__x;
  features *_repr;
  size_t pos;
  v_array<Search::action_repr> *v;
  undefined4 *puVar4;
  features *in_stack_ffffffffffffff80;
  undefined4 local_40 [2];
  size_t local_38;
  action *local_30;
  uint local_24;
  long local_18;
  
  local_40[0] = 0;
  puVar4 = local_40;
  __x = (value_type *)0x0;
  _repr = (features *)0x0;
  pos = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_18 = in_RSI;
  a_00 = search_predict(in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c4,
                        in_stack_000003b8,in_stack_000003b0,in_stack_00000400,in_stack_00000408,
                        in_stack_00000410,in_stack_00000418,in_stack_00000420,in_stack_00000428,
                        in_stack_00000430,in_stack_000003ac);
  v = in_stack_00000018;
  if (*(int *)(*in_RDI + 0x6c) == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)_repr,__x);
    v = in_stack_00000018;
  }
  if ((local_24 != 0) &&
     (sVar1 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)
                         (local_18 + (ulong)a_00 * 0x68d0 + 0x6828)), sVar1 != 0)) {
    uVar3 = (ulong)local_24;
    sVar1 = v_array<Search::action_repr>::size((v_array<Search::action_repr> *)(*in_RDI + 0x158));
    if ((uVar3 < sVar1) &&
       (paVar2 = v_array<Search::action_repr>::operator[]
                           ((v_array<Search::action_repr> *)(*in_RDI + 0x158),(ulong)local_24),
       paVar2->repr != (features *)0x0)) {
      v_array<Search::action_repr>::operator[]
                ((v_array<Search::action_repr> *)(*in_RDI + 0x158),(ulong)local_24);
      features::delete_v(in_stack_00000010);
      paVar2 = v_array<Search::action_repr>::operator[]
                         ((v_array<Search::action_repr> *)(*in_RDI + 0x158),(ulong)local_24);
      if (paVar2->repr != (features *)0x0) {
        operator_delete(paVar2->repr);
      }
    }
    v_array<COST_SENSITIVE::wclass>::operator[]
              ((v_array<COST_SENSITIVE::wclass> *)(local_18 + (ulong)a_00 * 0x68d0 + 0x6828),0);
    action_repr::action_repr((action_repr *)v,(action)(pos >> 0x20),_repr);
    item.repr = in_stack_ffffffffffffff80;
    item._0_8_ = puVar4;
    push_at<Search::action_repr>(v,item,pos);
  }
  if ((*(byte *)(*in_RDI + 0x11) & 1) != 0) {
    action_hamming_loss(a_00,local_30,local_38);
    loss((search *)in_stack_00000010,in_stack_00000008._4_4_);
  }
  return a_00;
}

Assistant:

action search::predictLDF(example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, size_t learner_id,
    float weight)
{
  float a_cost = 0.;
  // TODO: action costs for ldf
  action a = search_predict(*priv, ecs, ec_cnt, mytag, oracle_actions, oracle_actions_cnt, condition_on,
      condition_on_names, nullptr, 0, nullptr, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if ((mytag != 0) && ecs[a].l.cs.costs.size() > 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    push_at(priv->ptag_to_action, action_repr(ecs[a].l.cs.costs[0].class_index, &(priv->last_action_repr)), mytag);
  }
  if (priv->auto_hamming_loss)
    loss(action_hamming_loss(a, oracle_actions, oracle_actions_cnt));  // TODO: action costs
  cdbg << "predict returning " << a << endl;
  return a;
}